

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

void slang::ast::Lookup::unqualifiedImpl
               (Scope *scope,string_view name,LookupLocation location,
               optional<slang::SourceRange> sourceRange,bitmask<slang::ast::LookupFlags> flags,
               SymbolIndex outOfBlockIndex,LookupResult *result,Scope *originalScope,
               SyntaxNode *originalSyntax)

{
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  string_view arg;
  string_view arg_00;
  string_view lookupName;
  SourceLocation left;
  string_view name_00;
  WildcardImportData *pWVar1;
  undefined1 *puVar2;
  Symbol **__x;
  bool bVar3;
  bool bVar4;
  SymbolMap *pSVar5;
  pointer ppVar6;
  TypeAliasType *this;
  ClassType *this_00;
  GenericClassDefSymbol *this_01;
  TransparentMemberSymbol *pTVar7;
  ModportClockingSymbol *pMVar8;
  pointer ppVar9;
  reference ppWVar10;
  equal_to<const_slang::ast::Symbol_*> *this_02;
  Symbol **__y;
  size_type sVar11;
  iterator pIVar12;
  SourceRange *pSVar13;
  reference pIVar14;
  Compilation *pCVar15;
  basic_string_view<char,_std::char_traits<char>_> *args_1;
  Scope *pSVar16;
  SubroutineSymbol *pSVar17;
  ConstraintBlockSymbol *this_03;
  Scope *pSVar18;
  Symbol *pSVar19;
  Compilation *in_RSI;
  Scope *in_RDI;
  bitmask<slang::ast::LookupFlags> in_R9D;
  pair<const_slang::ast::ClassType_*,_bool> pVar20;
  LookupLocation LVar21;
  _Optional_payload_base<slang::SourceRange> in_stack_00000000;
  SymbolIndex in_stack_00000018;
  SymbolIndex in_stack_00000020;
  undefined4 in_stack_00000024;
  Scope *in_stack_00000028;
  Scope *in_stack_00000030;
  long in_stack_00000038;
  Type *baseClass;
  Symbol *sym;
  Diagnostic *diag_2;
  Import *pair;
  iterator __end7;
  iterator __begin7;
  SmallVector<Import,_4UL> *__range7;
  Diagnostic *diag_1;
  Symbol *imported;
  PackageSymbol *package;
  WildcardImportSymbol *import;
  iterator __end4;
  iterator __begin4;
  vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
  *__range4;
  SmallSet<const_slang::ast::Symbol_*,_2UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
  importDedup;
  SmallVector<Import,_4UL> imports;
  iterator it_1;
  WildcardImportData *wildcardImportData;
  DeclaredType *declaredType;
  bool done;
  Diagnostic *diag;
  SourceLocation loc;
  SourceManager *sm;
  ClassType *containingClass;
  Scope *enumScope;
  bool skipLocationCheck;
  Symbol *wrapped;
  MethodPrototypeSymbol *sub_1;
  SubroutineSymbol *sub;
  ForwardingTypedefSymbol *forward;
  bool locationGood;
  const_iterator it;
  Symbol *symbol;
  SymbolMap *nameMap;
  anon_class_32_4_2e62d3a1 reportRecursiveError;
  size_t hash_1;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  locator loc_1;
  size_t pos0;
  size_t hash_2;
  Symbol **k;
  uint n_2;
  value_type *p_2;
  value_type *elements_2;
  int mask_2;
  group_type *pg_2;
  size_t pos_2;
  prober pb_2;
  locator loc_2;
  size_t pos0_1;
  size_t hash_3;
  basic_string_view<char,_std::char_traits<char>_> *k_1;
  uint n_3;
  value_type *p_3;
  value_type *elements_3;
  int mask_3;
  group_type *pg_3;
  size_t pos_3;
  prober pb_3;
  Scope *in_stack_fffffffffffff458;
  LookupResult *in_stack_fffffffffffff460;
  SourceLocation in_stack_fffffffffffff468;
  undefined4 in_stack_fffffffffffff470;
  DiagCode in_stack_fffffffffffff474;
  LookupResult *in_stack_fffffffffffff478;
  SourceLocation in_stack_fffffffffffff480;
  SourceLocation in_stack_fffffffffffff488;
  undefined4 in_stack_fffffffffffff490;
  DiagCode in_stack_fffffffffffff494;
  Diagnostic *in_stack_fffffffffffff4a0;
  Symbol *in_stack_fffffffffffff4a8;
  WildcardImportSymbol *in_stack_fffffffffffff4b0;
  Symbol **in_stack_fffffffffffff4c0;
  SymbolMap *pSVar22;
  size_t in_stack_fffffffffffff4c8;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
  *in_stack_fffffffffffff4d0;
  ExplicitImportSymbol *in_stack_fffffffffffff4e8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
  *this_04;
  undefined4 in_stack_fffffffffffff588;
  uint in_stack_fffffffffffff58c;
  undefined1 *in_stack_fffffffffffff590;
  char *in_stack_fffffffffffff598;
  byte local_a41;
  MethodPrototypeSymbol *in_stack_fffffffffffff5d8;
  bool local_9d1;
  bool local_9b9;
  bool local_9a9;
  Symbol *in_stack_fffffffffffff658;
  Compilation *in_stack_fffffffffffff660;
  bitmask<slang::ast::LookupFlags> local_930;
  bitmask<slang::ast::LookupResultFlags> local_929;
  Type *local_928;
  LookupLocation local_920;
  Symbol *local_910;
  Scope *local_908;
  uint32_t local_900;
  Scope *local_8f8;
  uint32_t local_8f0;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_8e8;
  undefined1 local_8c9 [65];
  SourceLocation local_888;
  SourceLocation SStack_880;
  undefined4 local_86c;
  Diagnostic *local_868;
  undefined4 in_stack_fffffffffffff7a0;
  undefined4 in_stack_fffffffffffff7a4;
  int iVar23;
  SourceLocation in_stack_fffffffffffff7a8;
  undefined4 in_stack_fffffffffffff7b0;
  undefined4 in_stack_fffffffffffff7b4;
  iterator local_828;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
  local_7d0 [2];
  Symbol *local_7a0;
  bitmask<slang::ast::LookupResultFlags> local_791;
  PackageSymbol *local_790;
  __unspec local_781;
  Scope *local_780;
  uint32_t local_778;
  LookupLocation local_770;
  type local_759;
  WildcardImportSymbol *local_758;
  WildcardImportSymbol **local_750;
  __normal_iterator<const_slang::ast::WildcardImportSymbol_**,_std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>_>
  local_748;
  WildcardImportData *local_740;
  undefined1 local_710 [40];
  ulong local_6e8;
  ulong local_6e0;
  SmallVectorBase<Import> local_6d8 [2];
  bitmask<slang::ast::LookupResultFlags> local_679;
  iterator local_678;
  char_pointer local_668;
  table_element_pointer_conflict local_660;
  bitmask<slang::ast::LookupFlags> local_654;
  WildcardImportData *local_650;
  DeclaredType *local_648;
  byte local_63a;
  bitmask<slang::ast::LookupResultFlags> local_639;
  undefined8 local_638;
  undefined4 local_62c;
  SourceLocation local_628;
  SourceLocation local_620;
  undefined4 local_614;
  Diagnostic *local_610;
  bitmask<slang::ast::LookupFlags> local_608;
  undefined1 local_601;
  SourceLocation local_600;
  SourceLocation local_5f8;
  _Optional_payload_base<bool> local_5ea;
  Token local_5e8;
  SourceLocation local_5d8;
  SourceManager *local_5d0;
  ClassType *local_5c8;
  undefined1 local_5c0;
  ClassType *local_5b8;
  undefined1 local_5b0;
  ClassType *local_5a8;
  Scope *local_5a0;
  byte local_591;
  Symbol *local_590;
  bitmask<slang::ast::LookupResultFlags> local_582;
  __unspec local_581;
  Scope *local_580;
  uint32_t local_578;
  LookupLocation local_570;
  type local_559;
  bitmask<slang::ast::LookupFlags> local_558;
  bitmask<slang::ast::MethodFlags> local_552;
  MethodPrototypeSymbol *local_550;
  bitmask<slang::ast::MethodFlags> local_542;
  SubroutineSymbol *local_540;
  ForwardingTypedefSymbol *local_538;
  __unspec local_529;
  Scope *local_528;
  uint32_t local_520;
  LookupLocation local_518;
  type local_502;
  bool local_501;
  const_iterator local_500;
  char_pointer local_4f0;
  table_element_pointer_conflict local_4e8;
  Compilation *local_4e0;
  SymbolMap *local_4d8;
  undefined1 *local_4d0;
  Scope *scope_00;
  bitmask<slang::ast::LookupFlags> flags_00;
  undefined4 in_stack_fffffffffffffb58;
  uint32_t uVar24;
  undefined4 in_stack_fffffffffffffb6c;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_418;
  undefined1 *local_408;
  SymbolMap *local_400;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_3f8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
  local_3e8;
  undefined1 *local_3d0;
  SymbolMap *local_3c8;
  iterator local_3c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
  local_3b0;
  undefined1 *local_398;
  SymbolMap *local_390;
  iterator local_388;
  size_t local_378;
  undefined1 *local_370;
  SymbolMap *local_368;
  size_t local_360;
  undefined1 *local_358;
  SymbolMap *local_350;
  uint local_344;
  value_type *local_340;
  value_type *local_338;
  uint local_32c;
  group_type *local_328;
  size_t local_320;
  pow2_quadratic_prober local_318;
  size_t local_308;
  size_t local_300;
  undefined1 *local_2f8;
  SymbolMap *local_2f0;
  uint local_2e4;
  value_type *local_2e0;
  value_type *local_2d8;
  uint local_2cc;
  group_type *local_2c8;
  size_t local_2c0;
  pow2_quadratic_prober local_2b8;
  size_t local_2a8;
  size_t local_2a0;
  undefined1 *local_298;
  SymbolMap *local_290;
  Symbol **local_288;
  undefined1 *local_280;
  bool local_271 [25];
  iterator local_258;
  bool local_241 [25];
  iterator local_228;
  bool local_211;
  iterator local_210;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::Symbol_*>
  local_200;
  char *local_1e8;
  size_t local_1e0;
  Symbol **local_1d8;
  Symbol **local_1d0;
  undefined1 *local_1c8;
  uint local_1bc;
  value_type *local_1b8;
  value_type *local_1b0;
  uint local_1a4;
  group_type *local_1a0;
  size_t local_198;
  pow2_quadratic_prober local_190;
  size_t local_180;
  char *local_178;
  Symbol **local_170;
  undefined1 *local_168;
  undefined1 local_159 [9];
  byte **local_150;
  SymbolMap *local_148;
  bool local_139 [25];
  iterator local_120;
  bool local_109 [25];
  iterator local_f0;
  bool local_d9;
  iterator local_d8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
  local_c8;
  size_t local_b0;
  basic_string_view<char,_std::char_traits<char>_> *local_a8;
  basic_string_view<char,_std::char_traits<char>_> *local_a0;
  Scope *local_98;
  byte **local_90;
  undefined1 *local_88;
  SymbolMap *local_80;
  uint local_74;
  value_type *local_70;
  value_type *local_68;
  uint local_5c;
  group_type *local_58;
  size_t local_50;
  pow2_quadratic_prober local_48;
  basic_string_view<char,_std::char_traits<char>_> *local_38;
  size_t local_30;
  basic_string_view<char,_std::char_traits<char>_> *local_28;
  SymbolMap *local_20;
  
  local_4d0 = &stack0x00000008;
  scope_00 = (Scope *)&stack0xfffffffffffffb70;
  pSVar5 = Scope::getNameMap((Scope *)in_stack_fffffffffffff460);
  local_4e0 = (Compilation *)0x0;
  local_408 = &stack0xfffffffffffffb70;
  local_4d8 = pSVar5;
  local_400 = pSVar5;
  local_3d0 = local_408;
  local_3c8 = pSVar5;
  local_358 = local_408;
  local_350 = pSVar5;
  local_360 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
              ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                        ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                          *)in_stack_fffffffffffff460,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffff458);
  puVar2 = local_358;
  local_300 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
              ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                              *)in_stack_fffffffffffff460,(size_t)in_stack_fffffffffffff458);
  local_2f8 = puVar2;
  local_308 = local_360;
  local_2f0 = pSVar5;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_318,local_300);
  do {
    local_320 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_318);
    local_328 = boost::unordered::detail::foa::
                table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                          *)0x4785b0);
    local_328 = local_328 + local_320;
    local_32c = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffff468,(size_t)in_stack_fffffffffffff460);
    if (local_32c != 0) {
      local_338 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                  ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                              *)0x4785fe);
      local_340 = local_338 + local_320 * 0xf;
      do {
        local_344 = boost::unordered::detail::foa::unchecked_countr_zero(0);
        in_stack_fffffffffffff660 =
             (Compilation *)
             boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
             ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                     *)0x478651);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
        ::
        key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>
                  ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
                    *)0x478684);
        bVar3 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           in_stack_fffffffffffff480,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff478,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
        if (bVar3) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
          ::table_locator(&local_3e8,local_328,local_344,local_340 + local_344);
          goto LAB_00478781;
        }
        local_32c = local_32c - 1 & local_32c;
      } while (local_32c != 0);
    }
    bVar3 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffff460,(size_t)in_stack_fffffffffffff458);
    if (bVar3) {
      memset(&local_3e8,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
      ::table_locator(&local_3e8);
      goto LAB_00478781;
    }
    bVar3 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_318,
                       (pSVar5->table_).
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                       .arrays.groups_size_mask);
  } while (bVar3);
  memset(&local_3e8,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
  ::table_locator(&local_3e8);
LAB_00478781:
  local_3c0 = boost::unordered::detail::foa::
              table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
              ::make_iterator((locator *)0x47878e);
  local_418.pc_ = local_3c0.pc_;
  local_418.p_ = local_3c0.p_;
  boost::unordered::detail::foa::
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  ::table_iterator<false,_nullptr>(&local_3f8,&local_418);
  local_4f0 = local_3f8.pc_;
  local_4e8 = local_3f8.p_;
  local_500 = boost::unordered::
              unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
              ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                     *)0x478820);
  bVar3 = boost::unordered::detail::foa::operator!=
                    ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                      *)in_stack_fffffffffffff460,
                     (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                      *)in_stack_fffffffffffff458);
  if (bVar3) {
    ppVar6 = boost::unordered::detail::foa::
             table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
             ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                           *)in_stack_fffffffffffff460);
    local_4e0 = (Compilation *)ppVar6->second;
    LVar21 = LookupLocation::before((Symbol *)in_stack_fffffffffffff460);
    local_528 = LVar21.scope;
    local_520 = LVar21.index;
    local_518.scope = local_528;
    local_518.index = local_520;
    local_502 = (type)LookupLocation::operator<=>
                                (&local_518,(LookupLocation *)&stack0xfffffffffffffb60);
    std::__cmp_cat::__unspec::__unspec(&local_529,(__unspec *)0x0);
    local_501 = std::operator<(local_502);
    if (local_501) {
      if ((*(SymbolKind *)&(local_4e0->super_BumpAllocator).head == TransparentMember) &&
         (in_stack_00000038 != 0)) {
        pTVar7 = Symbol::as<slang::ast::TransparentMemberSymbol>((Symbol *)0x478c3e);
        local_590 = pTVar7->wrapped;
        if (local_590->kind == EnumValue) {
          local_591 = 0;
          pSVar18 = Symbol::getParentScope(local_590);
          pSVar19 = Scope::asSymbol(pSVar18);
          local_5a0 = Symbol::getParentScope(pSVar19);
          pSVar19 = Scope::asSymbol(local_5a0);
          if (pSVar19->kind == ClassType) {
            pVar20 = getContainingClass((Scope *)CONCAT44(in_stack_fffffffffffff494,
                                                          in_stack_fffffffffffff490));
            local_5c8 = pVar20.first;
            local_5c0 = pVar20.second;
            local_5b8 = local_5c8;
            local_5b0 = local_5c0;
            local_5a8 = local_5c8;
            if (local_5c8 != (ClassType *)0x0) {
              Scope::asSymbol(local_5a0);
              Symbol::as<slang::ast::ClassType>((Symbol *)0x478d1a);
              bVar3 = Type::isDerivedFrom((Type *)in_stack_fffffffffffff478,
                                          (Type *)CONCAT44(in_stack_fffffffffffff474,
                                                           in_stack_fffffffffffff470));
              if (bVar3) {
                local_591 = 1;
              }
            }
          }
          pCVar15 = Scope::getCompilation(in_RDI);
          local_5d0 = Compilation::getSourceManager(pCVar15);
          if ((local_5d0 != (SourceManager *)0x0) && ((local_591 & 1) == 0)) {
            local_5e8 = slang::syntax::SyntaxNode::getFirstToken
                                  ((SyntaxNode *)
                                   CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
            local_600 = parsing::Token::location(&local_5e8);
            local_5f8 = local_590->location;
            left._4_4_ = in_stack_fffffffffffff7b4;
            left._0_4_ = in_stack_fffffffffffff7b0;
            local_5d8 = local_600;
            local_5ea = (_Optional_payload_base<bool>)
                        SourceManager::isBeforeInCompilationUnit
                                  ((SourceManager *)
                                   CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                                   left,in_stack_fffffffffffff7a8);
            local_601 = 1;
            local_501 = std::optional<bool>::value_or<bool>
                                  ((optional<bool> *)in_stack_fffffffffffff468,
                                   (bool *)in_stack_fffffffffffff460);
          }
        }
      }
    }
    else {
      local_538 = (ForwardingTypedefSymbol *)0x0;
      in_stack_fffffffffffff658 =
           (Symbol *)(ulong)(*(SymbolKind *)&(local_4e0->super_BumpAllocator).head - EnumValue);
      switch(in_stack_fffffffffffff658) {
      case (Symbol *)0x0:
      case (Symbol *)0x1c:
      case (Symbol *)0x3f:
        local_558 = ast::operator~((LookupFlags)in_stack_fffffffffffff460);
        bitmask<slang::ast::LookupFlags>::operator&=
                  ((bitmask<slang::ast::LookupFlags> *)&stack0xfffffffffffffb5c,&local_558);
        break;
      default:
        break;
      case (Symbol *)0xb:
        this_00 = Symbol::as<slang::ast::ClassType>((Symbol *)0x478965);
        local_538 = ClassType::getFirstForwardDecl(this_00);
        break;
      case (Symbol *)0x18:
        this = Symbol::as<slang::ast::TypeAliasType>((Symbol *)0x478943);
        local_538 = TypeAliasType::getFirstForwardDecl(this);
        break;
      case (Symbol *)0x35:
        local_540 = Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)0x4789a9);
        bVar3 = DeclaredType::isEvaluating(&local_540->declaredReturnType);
        if (bVar3) {
          unqualifiedImpl::anon_class_32_4_2e62d3a1::operator()
                    ((anon_class_32_4_2e62d3a1 *)in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8
                    );
          return;
        }
        SubroutineSymbol::getReturnType((SubroutineSymbol *)0x4789ef);
        bVar3 = Type::isVoid((Type *)0x4789f7);
        local_9a9 = true;
        if (!bVar3) {
          bitmask<slang::ast::MethodFlags>::bitmask(&local_542,BuiltIn);
          local_9a9 = bitmask<slang::ast::MethodFlags>::has
                                ((bitmask<slang::ast::MethodFlags> *)in_stack_fffffffffffff460,
                                 (bitmask<slang::ast::MethodFlags> *)in_stack_fffffffffffff458);
        }
        local_501 = local_9a9;
        break;
      case (Symbol *)0x38:
        this_01 = Symbol::as<slang::ast::GenericClassDefSymbol>((Symbol *)0x478987);
        local_538 = GenericClassDefSymbol::getFirstForwardDecl(this_01);
        break;
      case (Symbol *)0x39:
        local_550 = Symbol::as<slang::ast::MethodPrototypeSymbol>((Symbol *)0x478a6d);
        bVar3 = DeclaredType::isEvaluating(&local_550->declaredReturnType);
        if (bVar3) {
          unqualifiedImpl::anon_class_32_4_2e62d3a1::operator()
                    ((anon_class_32_4_2e62d3a1 *)in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8
                    );
          return;
        }
        MethodPrototypeSymbol::getReturnType((MethodPrototypeSymbol *)0x478ab3);
        bVar3 = Type::isVoid((Type *)0x478abb);
        local_9b9 = true;
        if (!bVar3) {
          bitmask<slang::ast::MethodFlags>::bitmask(&local_552,BuiltIn);
          local_9b9 = bitmask<slang::ast::MethodFlags>::has
                                ((bitmask<slang::ast::MethodFlags> *)in_stack_fffffffffffff460,
                                 (bitmask<slang::ast::MethodFlags> *)in_stack_fffffffffffff458);
        }
        local_501 = local_9b9;
        break;
      case (Symbol *)0x44:
      case (Symbol *)0x45:
        local_501 = true;
      }
      if (local_538 != (ForwardingTypedefSymbol *)0x0) {
        LVar21 = LookupLocation::before((Symbol *)in_stack_fffffffffffff460);
        local_580 = LVar21.scope;
        local_578 = LVar21.index;
        local_570.scope = local_580;
        local_570.index = local_578;
        local_559 = (type)LookupLocation::operator<=>
                                    (&local_570,(LookupLocation *)&stack0xfffffffffffffb60);
        std::__cmp_cat::__unspec::__unspec(&local_581,(__unspec *)0x0);
        local_501 = std::operator<(local_559);
        bitmask<slang::ast::LookupResultFlags>::bitmask(&local_582,FromForwardTypedef);
        bitmask<slang::ast::LookupResultFlags>::operator|=
                  ((bitmask<slang::ast::LookupResultFlags> *)((long)&in_stack_00000028->nameMap + 4)
                   ,&local_582);
      }
    }
    local_9d1 = true;
    if ((local_501 & 1U) == 0) {
      bitmask<slang::ast::LookupFlags>::bitmask(&local_608,AllowDeclaredAfter);
      local_9d1 = bitmask<slang::ast::LookupFlags>::has
                            ((bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffff460,
                             (bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffff458);
    }
    if (local_9d1 != false) {
      if (*(SymbolKind *)&(local_4e0->super_BumpAllocator).head == TransparentMember) {
        do {
          pTVar7 = Symbol::as<slang::ast::TransparentMemberSymbol>((Symbol *)0x478e8c);
          local_4e0 = (Compilation *)pTVar7->wrapped;
        } while (*(SymbolKind *)&(local_4e0->super_BumpAllocator).head == TransparentMember);
        pSVar18 = Symbol::getParentScope((Symbol *)local_4e0);
        pSVar19 = Scope::asSymbol(pSVar18);
        if (pSVar19->kind == AnonymousProgram) {
          Scope::asSymbol(in_stack_00000030);
          bVar3 = anon_unknown_39::isInProgram((Symbol *)in_stack_fffffffffffff468);
          if ((!bVar3) &&
             (bVar3 = std::optional::operator_cast_to_bool((optional<slang::SourceRange> *)0x478eed)
             , bVar3)) {
            local_614 = 0xf000a;
            pSVar13 = std::optional<slang::SourceRange>::operator*
                                ((optional<slang::SourceRange> *)0x478f30);
            local_628 = pSVar13->startLoc;
            local_620 = pSVar13->endLoc;
            sourceRange_00.endLoc = in_stack_fffffffffffff488;
            sourceRange_00.startLoc = in_stack_fffffffffffff480;
            local_610 = LookupResult::addDiag
                                  (in_stack_fffffffffffff478,
                                   (Scope *)CONCAT44(in_stack_fffffffffffff474,
                                                     in_stack_fffffffffffff470),
                                   in_stack_fffffffffffff494,sourceRange_00);
            local_62c = 0x50001;
            local_638._0_4_ = (local_4e0->options).maxCheckerInstanceDepth;
            local_638._4_4_ = (local_4e0->options).maxGenerateSteps;
            Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffff460,in_stack_fffffffffffff474,
                                in_stack_fffffffffffff468);
          }
        }
      }
      switch(*(SymbolKind *)&(local_4e0->super_BumpAllocator).head) {
      case ForwardingTypedef:
        break;
      default:
        in_stack_00000028->compilation = local_4e0;
        break;
      case ModportClocking:
        pMVar8 = Symbol::as<slang::ast::ModportClockingSymbol>((Symbol *)0x479095);
        in_stack_00000028->compilation = (Compilation *)pMVar8->target;
        break;
      case ExplicitImport:
        Symbol::as<slang::ast::ExplicitImportSymbol>((Symbol *)0x478fff);
        pCVar15 = (Compilation *)ExplicitImportSymbol::importedSymbol(in_stack_fffffffffffff4e8);
        in_stack_00000028->compilation = pCVar15;
        bitmask<slang::ast::LookupResultFlags>::bitmask(&local_639,WasImported);
        bitmask<slang::ast::LookupResultFlags>::operator|=
                  ((bitmask<slang::ast::LookupResultFlags> *)((long)&in_stack_00000028->nameMap + 4)
                   ,&local_639);
        Scope::getCompilation(in_RDI);
        Compilation::noteReference
                  ((Compilation *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                   (Symbol *)in_stack_fffffffffffff468,
                   SUB81((ulong)in_stack_fffffffffffff460 >> 0x38,0));
        break;
      case MethodPrototype:
        Symbol::as<slang::ast::MethodPrototypeSymbol>((Symbol *)0x479070);
        pCVar15 = (Compilation *)MethodPrototypeSymbol::getSubroutine(in_stack_fffffffffffff5d8);
        in_stack_00000028->compilation = pCVar15;
      }
      local_63a = 1;
      if (((in_stack_00000028->compilation != (Compilation *)0x0) &&
          (local_648 = Symbol::getDeclaredType((Symbol *)in_stack_fffffffffffff468),
          local_648 != (DeclaredType *)0x0)) &&
         (bVar3 = DeclaredType::isEvaluating(local_648), bVar3)) {
        if ((local_501 & 1U) == 0) {
          local_63a = 0;
          LookupResult::clear(in_stack_fffffffffffff460);
        }
        else {
          unqualifiedImpl::anon_class_32_4_2e62d3a1::operator()
                    ((anon_class_32_4_2e62d3a1 *)in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8
                    );
        }
      }
      if ((local_63a & 1) != 0) {
        return;
      }
    }
  }
  local_650 = Scope::getWildcardImportData(in_RDI);
  if (local_650 == (WildcardImportData *)0x0) goto LAB_0047a7b5;
  bitmask<slang::ast::LookupFlags>::bitmask(&local_654,DisallowWildcardImport);
  bVar3 = bitmask<slang::ast::LookupFlags>::has
                    ((bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffff460,
                     (bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffff458);
  if (bVar3) {
    if ((local_650->hasForceElaborated & 1U) == 0) {
      local_650->hasForceElaborated = true;
      Scope::getCompilation(in_RDI);
      Scope::asSymbol(in_RDI);
      Compilation::forceElaborate(in_stack_fffffffffffff660,in_stack_fffffffffffff658);
    }
    pWVar1 = local_650;
    pSVar5 = &local_650->importedSymbols;
    local_398 = &stack0xfffffffffffffb70;
    local_390 = pSVar5;
    local_370 = local_398;
    local_368 = pSVar5;
    local_378 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                          ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                            *)in_stack_fffffffffffff460,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff458);
    puVar2 = local_370;
    local_2a0 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                *)in_stack_fffffffffffff460,(size_t)in_stack_fffffffffffff458);
    local_298 = puVar2;
    local_2a8 = local_378;
    local_290 = pSVar5;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
              (&local_2b8,local_2a0);
    do {
      local_2c0 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_2b8);
      local_2c8 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                  ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                            *)0x479325);
      local_2c8 = local_2c8 + local_2c0;
      local_2cc = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_fffffffffffff468,(size_t)in_stack_fffffffffffff460);
      if (local_2cc != 0) {
        local_2d8 = boost::unordered::detail::foa::
                    table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                    ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                *)0x479373);
        local_2e0 = local_2d8 + local_2c0 * 0xf;
        do {
          local_2e4 = boost::unordered::detail::foa::unchecked_countr_zero(0);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
          ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                  *)0x4793c6);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
          ::
          key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>
                    ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
                      *)0x4793f9);
          bVar3 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                            ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                             in_stack_fffffffffffff480,
                             (basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_fffffffffffff478,
                             (basic_string_view<char,_std::char_traits<char>_> *)
                             CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
          if (bVar3) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
            ::table_locator(&local_3b0,local_2c8,local_2e4,local_2e0 + local_2e4);
            goto LAB_004794f6;
          }
          local_2cc = local_2cc - 1 & local_2cc;
        } while (local_2cc != 0);
      }
      bVar3 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  in_stack_fffffffffffff460,(size_t)in_stack_fffffffffffff458);
      if (bVar3) {
        memset(&local_3b0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
        ::table_locator(&local_3b0);
        goto LAB_004794f6;
      }
      bVar3 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_2b8,
                         (pWVar1->importedSymbols).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                         .arrays.groups_size_mask);
    } while (bVar3);
    memset(&local_3b0,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
    ::table_locator(&local_3b0);
LAB_004794f6:
    local_388 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                ::make_iterator((locator *)0x479503);
    local_668 = local_388.pc_;
    local_660 = local_388.p_;
    local_678 = boost::unordered::
                unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                       *)0x479564);
    bVar3 = boost::unordered::detail::foa::operator!=
                      ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                        *)in_stack_fffffffffffff460,
                       (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                        *)in_stack_fffffffffffff458);
    if (bVar3) {
      bitmask<slang::ast::LookupResultFlags>::bitmask(&local_679,WasImported);
      bitmask<slang::ast::LookupResultFlags>::operator|=
                ((bitmask<slang::ast::LookupResultFlags> *)((long)&in_stack_00000028->nameMap + 4),
                 &local_679);
      ppVar9 = boost::unordered::detail::foa::
               table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
               ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                             *)0x4795c7);
      in_stack_00000028->compilation = (Compilation *)ppVar9->second;
      return;
    }
    goto LAB_0047a7b5;
  }
  SmallVector<Import,_4UL>::SmallVector((SmallVector<Import,_4UL> *)0x4795ed);
  SmallSet<const_slang::ast::Symbol_*,_2UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
  ::SmallSet((SmallSet<const_slang::ast::Symbol_*,_2UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
              *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  local_740 = local_650;
  local_748._M_current =
       (WildcardImportSymbol **)
       std::
       vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
       ::begin((vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
                *)in_stack_fffffffffffff458);
  local_750 = (WildcardImportSymbol **)
              std::
              vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
              ::end((vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
                     *)in_stack_fffffffffffff458);
  while (bVar3 = __gnu_cxx::
                 operator==<const_slang::ast::WildcardImportSymbol_**,_std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>_>
                           ((__normal_iterator<const_slang::ast::WildcardImportSymbol_**,_std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>_>
                             *)in_stack_fffffffffffff460,
                            (__normal_iterator<const_slang::ast::WildcardImportSymbol_**,_std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>_>
                             *)in_stack_fffffffffffff458), ((bVar3 ^ 0xffU) & 1) != 0) {
    ppWVar10 = __gnu_cxx::
               __normal_iterator<const_slang::ast::WildcardImportSymbol_**,_std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>_>
               ::operator*(&local_748);
    local_758 = *ppWVar10;
    LVar21 = LookupLocation::after((Symbol *)in_stack_fffffffffffff460);
    local_780 = LVar21.scope;
    local_778 = LVar21.index;
    local_770.scope = local_780;
    local_770.index = local_778;
    local_759 = (type)LookupLocation::operator<=>
                                ((LookupLocation *)&stack0xfffffffffffffb60,&local_770);
    std::__cmp_cat::__unspec::__unspec(&local_781,(__unspec *)0x0);
    bVar3 = std::operator<(local_759);
    if (bVar3) break;
    local_790 = WildcardImportSymbol::getPackage(in_stack_fffffffffffff4b0);
    if (local_790 == (PackageSymbol *)0x0) {
      bitmask<slang::ast::LookupResultFlags>::bitmask(&local_791,SuppressUndeclared);
      bitmask<slang::ast::LookupResultFlags>::operator|=
                ((bitmask<slang::ast::LookupResultFlags> *)((long)&in_stack_00000028->nameMap + 4),
                 &local_791);
    }
    else {
      lookupName._M_str = in_stack_fffffffffffff598;
      lookupName._M_len = (size_t)in_stack_fffffffffffff590;
      local_7a0 = PackageSymbol::findForImport
                            ((PackageSymbol *)
                             CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588),
                             lookupName);
      local_a41 = 0;
      if (local_7a0 != (Symbol *)0x0) {
        in_stack_fffffffffffff590 = local_710;
        local_288 = &local_7a0;
        local_280 = in_stack_fffffffffffff590;
        local_1d0 = local_288;
        local_1c8 = in_stack_fffffffffffff590;
        local_1d8 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,16ul,16ul>>
                    ::key_from<slang::ast::Symbol_const*>((Symbol **)0x47989a);
        local_1e0 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,16ul,16ul>>
                    ::hash_for<slang::ast::Symbol_const*>
                              ((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
                                *)in_stack_fffffffffffff460,(Symbol **)in_stack_fffffffffffff458);
        in_stack_fffffffffffff598 =
             (char *)boost::unordered::detail::foa::
                     table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
                     ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
                                     *)in_stack_fffffffffffff460,(size_t)in_stack_fffffffffffff458);
        local_170 = local_1d8;
        local_180 = local_1e0;
        local_1e8 = in_stack_fffffffffffff598;
        local_178 = in_stack_fffffffffffff598;
        local_168 = in_stack_fffffffffffff590;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_190,(size_t)in_stack_fffffffffffff598);
        do {
          local_198 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_190);
          local_1a0 = boost::unordered::detail::foa::
                      table_arrays<const_slang::ast::Symbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
                      ::groups((table_arrays<const_slang::ast::Symbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
                                *)0x47999d);
          local_1a0 = local_1a0 + local_198;
          in_stack_fffffffffffff58c =
               boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::match((group15<boost::unordered::detail::foa::plain_integral> *)
                       in_stack_fffffffffffff468,(size_t)in_stack_fffffffffffff460);
          local_1a4 = in_stack_fffffffffffff58c;
          if (in_stack_fffffffffffff58c != 0) {
            local_1b0 = boost::unordered::detail::foa::
                        table_arrays<const_slang::ast::Symbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
                        ::elements((table_arrays<const_slang::ast::Symbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
                                    *)0x4799ff);
            local_1b8 = local_1b0 + local_198 * 0xf;
            do {
              local_1bc = boost::unordered::detail::foa::unchecked_countr_zero(0);
              this_02 = boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
                        ::pred((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
                                *)0x479a52);
              __x = local_170;
              __y = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,16ul,16ul>>
                    ::key_from<slang::ast::Symbol_const*>((Symbol **)0x479a82);
              bVar3 = std::equal_to<const_slang::ast::Symbol_*>::operator()(this_02,__x,__y);
              if (bVar3) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::Symbol_*>
                ::table_locator(&local_200,local_1a0,local_1bc,local_1b8 + local_1bc);
                goto LAB_00479b9e;
              }
              local_1a4 = local_1a4 - 1 & local_1a4;
            } while (local_1a4 != 0);
          }
          bVar3 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_fffffffffffff460,(size_t)in_stack_fffffffffffff458);
          if (bVar3) {
            memset(&local_200,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::Symbol_*>
            ::table_locator(&local_200);
            goto LAB_00479b9e;
          }
          bVar3 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                            (&local_190,*(size_t *)(in_stack_fffffffffffff590 + 0x10));
        } while (bVar3);
        memset(&local_200,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::Symbol_*>
        ::table_locator(&local_200);
LAB_00479b9e:
        bVar3 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                          ((table_locator *)&local_200);
        if (bVar3) {
          local_210 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
                      ::make_iterator((locator *)0x479bc0);
          local_211 = false;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (local_7d0,&local_210,&local_211);
        }
        else if (local_6e0 < local_6e8) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,16ul,16ul>>
          ::unchecked_emplace_at<slang::ast::Symbol_const*&>
                    ((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
                      *)in_stack_fffffffffffff480,(size_t)in_stack_fffffffffffff478,
                     CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                     (Symbol **)in_stack_fffffffffffff468);
          local_228 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
                      ::make_iterator((locator *)0x479c48);
          local_241[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (local_7d0,&local_228,local_241);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,16ul,16ul>>
          ::unchecked_emplace_with_rehash<slang::ast::Symbol_const*&>
                    (in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0);
          local_258 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
                      ::make_iterator((locator *)0x479cb3);
          local_271[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (local_7d0,&local_258,local_271);
        }
        local_a41 = local_7d0[0].second;
      }
      if ((local_a41 & 1) != 0) {
        SmallVectorBase<slang::ast::Lookup::unqualifiedImpl(slang::ast::Scope_const&,std::basic_string_view<char,std::char_traits<char>>,slang::ast::LookupLocation,std::optional<slang::SourceRange>,slang::bitmask<slang::ast::LookupFlags>,slang::ast::SymbolIndex,slang::ast::LookupResult&,slang::ast::Scope_const&,slang::syntax::SyntaxNode_const*)::Import>
        ::
        emplace_back<slang::ast::Lookup::unqualifiedImpl(slang::ast::Scope_const&,std::basic_string_view<char,std::char_traits<char>>,slang::ast::LookupLocation,std::optional<slang::SourceRange>,slang::bitmask<slang::ast::LookupFlags>,slang::ast::SymbolIndex,slang::ast::LookupResult&,slang::ast::Scope_const&,slang::syntax::SyntaxNode_const*)::Import>
                  ((SmallVectorBase<Import> *)in_stack_fffffffffffff468,
                   (Import *)in_stack_fffffffffffff460);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::WildcardImportSymbol_**,_std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>_>
    ::operator++(&local_748);
  }
  bVar3 = SmallVectorBase<Import>::empty(local_6d8);
  if (bVar3) {
    iVar23 = 0;
  }
  else {
    sVar11 = SmallVectorBase<Import>::size(local_6d8);
    if (sVar11 < 2) {
      if ((local_4e0 != (Compilation *)0x0) &&
         (bVar3 = std::optional::operator_cast_to_bool((optional<slang::SourceRange> *)0x479f7a),
         bVar3)) {
        if (*(SymbolKind *)&(local_4e0->super_BumpAllocator).head == ExplicitImport) {
          Symbol::as<slang::ast::ExplicitImportSymbol>((Symbol *)0x479f9d);
          pSVar19 = ExplicitImportSymbol::importedSymbol(in_stack_fffffffffffff4e8);
          pIVar14 = SmallVectorBase<Import>::operator[](local_6d8,0);
          if (pSVar19 == pIVar14->imported) goto LAB_0047a1c2;
        }
        local_86c = 0x10000a;
        pSVar13 = std::optional<slang::SourceRange>::operator*
                            ((optional<slang::SourceRange> *)0x47a02a);
        local_888 = pSVar13->startLoc;
        SStack_880 = pSVar13->endLoc;
        sourceRange_02.endLoc = in_stack_fffffffffffff488;
        sourceRange_02.startLoc = in_stack_fffffffffffff480;
        local_868 = LookupResult::addDiag
                              (in_stack_fffffffffffff478,
                               (Scope *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470
                                                ),in_stack_fffffffffffff494,sourceRange_02);
        arg_00._M_str = (char *)in_stack_fffffffffffff4b0;
        arg_00._M_len = (size_t)in_stack_fffffffffffff4a8;
        Diagnostic::operator<<(in_stack_fffffffffffff4a0,arg_00);
        local_8c9._45_4_ = 0x50001;
        local_8c9._33_8_ = *(undefined8 *)&(local_4e0->options).maxCheckerInstanceDepth;
        Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffff460,in_stack_fffffffffffff474,
                            in_stack_fffffffffffff468);
        local_8c9._29_4_ = 0x3f000a;
        pIVar14 = SmallVectorBase<Import>::operator[](local_6d8,0);
        local_8c9._17_8_ = (pIVar14->import->super_Symbol).location;
        Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffff460,in_stack_fffffffffffff474,
                            in_stack_fffffffffffff468);
        local_8c9._13_4_ = 0x50001;
        pIVar14 = SmallVectorBase<Import>::operator[](local_6d8,0);
        local_8c9._1_8_ = pIVar14->imported->location;
        Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffff460,in_stack_fffffffffffff474,
                            in_stack_fffffffffffff468);
      }
LAB_0047a1c2:
      this_04 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                 *)local_8c9;
      bitmask<slang::ast::LookupResultFlags>::bitmask
                ((bitmask<slang::ast::LookupResultFlags> *)this_04,WasImported);
      bitmask<slang::ast::LookupResultFlags>::operator|=
                ((bitmask<slang::ast::LookupResultFlags> *)((long)&in_stack_00000028->nameMap + 4),
                 (bitmask<slang::ast::LookupResultFlags> *)this_04);
      pIVar14 = SmallVectorBase<Import>::operator[](local_6d8,0);
      in_stack_00000028->compilation = (Compilation *)pIVar14->imported;
      pCVar15 = Scope::getCompilation(in_RDI);
      pIVar14 = SmallVectorBase<Import>::operator[](local_6d8,0);
      Compilation::noteReference
                ((Compilation *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                 (Symbol *)in_stack_fffffffffffff468,
                 SUB81((ulong)in_stack_fffffffffffff460 >> 0x38,0));
      pSVar22 = &local_650->importedSymbols;
      local_150 = &(in_stack_00000028->compilation->super_BumpAllocator).endPtr;
      local_88 = local_159;
      local_98 = in_stack_00000028;
      local_148 = pSVar22;
      local_90 = local_150;
      local_80 = pSVar22;
      local_a0 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                 ::
                 key_from<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>
                           (local_150,in_stack_00000028);
      args_1 = (basic_string_view<char,_std::char_traits<char>_> *)
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
               ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                         ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                           *)in_stack_fffffffffffff460,
                          (basic_string_view<char,_std::char_traits<char>_> *)
                          in_stack_fffffffffffff458);
      local_a8 = args_1;
      local_b0 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                 ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                 *)in_stack_fffffffffffff460,(size_t)in_stack_fffffffffffff458);
      local_28 = local_a0;
      local_38 = local_a8;
      pSVar5 = pSVar22;
      local_30 = local_b0;
      local_20 = pSVar22;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_48,local_b0);
      do {
        local_50 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_48);
        local_58 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                   ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                             *)0x47a412);
        local_58 = local_58 + local_50;
        local_5c = boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match
                             ((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffff468,(size_t)in_stack_fffffffffffff460);
        if (local_5c != 0) {
          local_68 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                     ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                 *)0x47a467);
          local_70 = local_68 + local_50 * 0xf;
          do {
            local_74 = boost::unordered::detail::foa::unchecked_countr_zero(0);
            in_stack_fffffffffffff4a0 =
                 (Diagnostic *)
                 boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                 ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                         *)0x47a4b7);
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
            ::
            key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>
                      ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
                        *)0x47a4e5);
            bVar3 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                    operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                               in_stack_fffffffffffff480,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_fffffffffffff478,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
            if (bVar3) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
              ::table_locator(&local_c8,local_58,local_74,local_70 + local_74);
              goto LAB_0047a5ec;
            }
            local_5c = local_5c - 1 & local_5c;
          } while (local_5c != 0);
        }
        bVar3 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffff460,(size_t)in_stack_fffffffffffff458);
        if (bVar3) {
          memset(&local_c8,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
          ::table_locator(&local_c8);
          goto LAB_0047a5ec;
        }
        bVar3 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_48,
                           (pSVar22->table_).
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                           .arrays.groups_size_mask);
      } while (bVar3);
      memset(&local_c8,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
      ::table_locator(&local_c8);
LAB_0047a5ec:
      bVar3 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                        ((table_locator *)&local_c8);
      if (bVar3) {
        local_d8 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                   ::make_iterator((locator *)0x47a60c);
        local_d9 = false;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_8e8,&local_d8,&local_d9);
      }
      else if ((pSVar5->table_).
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
               .size_ctrl.size <
               (pSVar5->table_).
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
               .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
        ::
        unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::Symbol_const*&>
                  ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                    *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                   (size_t)in_stack_fffffffffffff488,(size_t)in_stack_fffffffffffff480,
                   (try_emplace_args_t *)in_stack_fffffffffffff478,
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                   (Symbol **)in_stack_fffffffffffff4a0);
        local_f0 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                   ::make_iterator((locator *)0x47a6a8);
        local_109[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_8e8,&local_f0,local_109);
        in_stack_fffffffffffff458 = local_98;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::Symbol_const*&>
                  (this_04,(size_t)pCVar15,(try_emplace_args_t *)pIVar14,args_1,(Symbol **)pSVar5);
        local_120 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                    ::make_iterator((locator *)0x47a720);
        local_139[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_8e8,&local_120,local_139);
      }
      iVar23 = 1;
    }
    else {
      bVar3 = std::optional::operator_cast_to_bool((optional<slang::SourceRange> *)0x479d8f);
      if (bVar3) {
        std::optional<slang::SourceRange>::operator*((optional<slang::SourceRange> *)0x479dd0);
        sourceRange_01.endLoc = in_stack_fffffffffffff488;
        sourceRange_01.startLoc = in_stack_fffffffffffff480;
        LookupResult::addDiag
                  (in_stack_fffffffffffff478,
                   (Scope *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                   in_stack_fffffffffffff494,sourceRange_01);
        arg._M_str = (char *)in_stack_fffffffffffff4b0;
        arg._M_len = (size_t)in_stack_fffffffffffff4a8;
        Diagnostic::operator<<(in_stack_fffffffffffff4a0,arg);
        local_828 = SmallVectorBase<Import>::begin(local_6d8);
        pIVar12 = SmallVectorBase<Import>::end(local_6d8);
        for (; local_828 != pIVar12; local_828 = local_828 + 1) {
          Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffff460,in_stack_fffffffffffff474,
                              in_stack_fffffffffffff468);
          Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffff460,in_stack_fffffffffffff474,
                              in_stack_fffffffffffff468);
        }
      }
      iVar23 = 1;
    }
  }
  SmallSet<const_slang::ast::Symbol_*,_2UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
  ::~SmallSet((SmallSet<const_slang::ast::Symbol_*,_2UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
               *)0x47a780);
  SmallVector<Import,_4UL>::~SmallVector((SmallVector<Import,_4UL> *)0x47a78d);
  if (iVar23 != 0) {
    return;
  }
LAB_0047a7b5:
  Scope::asSymbol(in_RDI);
  LVar21 = LookupLocation::after((Symbol *)in_stack_fffffffffffff460);
  local_908 = LVar21.scope;
  local_900 = LVar21.index;
  local_8f8 = local_908;
  local_8f0 = local_900;
  pSVar18 = local_908;
  uVar24 = local_900;
  pSVar16 = LookupLocation::getScope((LookupLocation *)&stack0xfffffffffffffb60);
  if (pSVar16 != (Scope *)0x0) {
    local_910 = Scope::asSymbol(in_RDI);
    flags_00.m_bits = (underlying_type)((ulong)in_RDI >> 0x20);
    if (local_910->kind == Subroutine) {
      pSVar17 = Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)0x47a85c);
      in_stack_00000020 = pSVar17->outOfBlockIndex;
    }
    else if (local_910->kind == ConstraintBlock) {
      this_03 = Symbol::as<slang::ast::ConstraintBlockSymbol>((Symbol *)0x47a888);
      in_stack_00000020 = ConstraintBlockSymbol::getOutOfBlockIndex(this_03);
    }
    else if (in_stack_00000020 != 0) {
      pSVar18 = LookupLocation::getScope((LookupLocation *)&stack0xfffffffffffffb60);
      LookupLocation::LookupLocation(&local_920,pSVar18,in_stack_00000020);
      in_stack_00000020 = 0;
      pSVar18 = local_920.scope;
      uVar24 = local_920.index;
    }
    if (local_910->kind == ClassType) {
      Symbol::as<slang::ast::ClassType>((Symbol *)0x47a90e);
      local_928 = ClassType::getBaseClass((ClassType *)in_stack_fffffffffffff460);
      if ((local_928 != (Type *)0x0) && (bVar3 = Type::isError((Type *)0x47a936), bVar3)) {
        bitmask<slang::ast::LookupResultFlags>::bitmask(&local_929,SuppressUndeclared);
        bitmask<slang::ast::LookupResultFlags>::operator|=
                  ((bitmask<slang::ast::LookupResultFlags> *)((long)&in_stack_00000028->nameMap + 4)
                   ,&local_929);
      }
    }
    bitmask<slang::ast::LookupFlags>::bitmask(&local_930,DisallowUnitReferences);
    bVar4 = bitmask<slang::ast::LookupFlags>::has
                      ((bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffff460,
                       (bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffff458);
    bVar3 = false;
    if (bVar4) {
      pSVar16 = LookupLocation::getScope((LookupLocation *)&stack0xfffffffffffffb60);
      pSVar19 = Scope::asSymbol(pSVar16);
      bVar3 = pSVar19->kind == CompilationUnit;
    }
    if (!bVar3) {
      LookupLocation::getScope((LookupLocation *)&stack0xfffffffffffffb60);
      name_00._M_len._4_4_ = in_stack_fffffffffffffb6c;
      name_00._M_len._0_4_ = uVar24;
      name_00._M_str = (char *)in_RSI;
      LVar21.scope._4_4_ = in_R9D.m_bits;
      LVar21.scope._0_4_ = in_stack_fffffffffffffb58;
      LVar21._8_8_ = pSVar18;
      unqualifiedImpl(scope_00,name_00,LVar21,(optional<slang::SourceRange>)in_stack_00000000,
                      flags_00,in_stack_00000018,
                      (LookupResult *)CONCAT44(in_stack_00000024,in_stack_00000020),
                      in_stack_00000028,(SyntaxNode *)in_stack_00000030);
    }
  }
  return;
}

Assistant:

void Lookup::unqualifiedImpl(const Scope& scope, std::string_view name, LookupLocation location,
                             std::optional<SourceRange> sourceRange, bitmask<LookupFlags> flags,
                             SymbolIndex outOfBlockIndex, LookupResult& result,
                             const Scope& originalScope, const SyntaxNode* originalSyntax) {
    auto reportRecursiveError = [&](const Symbol& symbol) {
        if (sourceRange) {
            auto& diag = result.addDiag(scope, diag::RecursiveDefinition, *sourceRange);
            diag << name;
            diag.addNote(diag::NoteDeclarationHere, symbol.location);
        }
        result.found = nullptr;
    };

    // Try a simple name lookup to see if we find anything.
    auto& nameMap = scope.getNameMap();
    const Symbol* symbol = nullptr;
    if (auto it = nameMap.find(name); it != nameMap.end()) {
        // If the lookup is for a local name, check that we can access the symbol (it must be
        // declared before use). Callables and block names can be referenced anywhere in the
        // scope, so the location doesn't matter for them.
        symbol = it->second;
        bool locationGood = LookupLocation::before(*symbol) < location;
        if (!locationGood) {
            // A type alias can have forward definitions, so check those locations as well.
            // The forward decls form a linked list that are always ordered by location,
            // so we only need to check the first one.
            const ForwardingTypedefSymbol* forward = nullptr;
            switch (symbol->kind) {
                case SymbolKind::TypeAlias:
                    forward = symbol->as<TypeAliasType>().getFirstForwardDecl();
                    break;
                case SymbolKind::ClassType:
                    forward = symbol->as<ClassType>().getFirstForwardDecl();
                    break;
                case SymbolKind::GenericClassDef:
                    forward = symbol->as<GenericClassDefSymbol>().getFirstForwardDecl();
                    break;
                case SymbolKind::Subroutine: {
                    // Subroutines can be referenced before they are declared if they
                    // are tasks or return void (tasks are always set to have a void
                    // return type internally so we only need one check here).
                    //
                    // It's important to check that we're not in the middle of evaluating
                    // the return type before we try to access that return type or
                    // we'll hard fail.
                    auto& sub = symbol->as<SubroutineSymbol>();
                    if (sub.declaredReturnType.isEvaluating()) {
                        reportRecursiveError(*symbol);
                        return;
                    }

                    // Also allow built-ins to always be found; they don't really
                    // have a location since they're intrinsically defined.
                    locationGood = sub.getReturnType().isVoid() ||
                                   sub.flags.has(MethodFlags::BuiltIn);
                    break;
                }
                case SymbolKind::MethodPrototype: {
                    // Same as above.
                    auto& sub = symbol->as<MethodPrototypeSymbol>();
                    if (sub.declaredReturnType.isEvaluating()) {
                        reportRecursiveError(*symbol);
                        return;
                    }

                    locationGood = sub.getReturnType().isVoid() ||
                                   sub.flags.has(MethodFlags::BuiltIn);
                    break;
                }
                case SymbolKind::Sequence:
                case SymbolKind::Property:
                    // Sequences and properties can always be referenced before declaration.
                    locationGood = true;
                    break;
                case SymbolKind::Parameter:
                case SymbolKind::Specparam:
                case SymbolKind::EnumValue:
                    // Constants can never be looked up before their declaration,
                    // to avoid problems with recursive constant evaluation.
                    flags &= ~LookupFlags::AllowDeclaredAfter;
                    break;
                default:
                    break;
            }

            if (forward) {
                locationGood = LookupLocation::before(*forward) < location;
                result.flags |= LookupResultFlags::FromForwardTypedef;
            }
        }
        else if (symbol->kind == SymbolKind::TransparentMember && originalSyntax) {
            // Enum values are special in that we can't always get a precise ordering
            // of where they are declared in a scope, since they can be declared inside
            // a nested subexpression. Check for correct location by looking at the
            // actual source locations involved.
            auto& wrapped = symbol->as<TransparentMemberSymbol>().wrapped;
            if (wrapped.kind == SymbolKind::EnumValue) {
                // If the enum was inherited from a base class then we shouldn't
                // worry about the source location; the base class may be declared
                // later in the file.
                bool skipLocationCheck = false;
                auto enumScope = wrapped.getParentScope()->asSymbol().getParentScope();
                SLANG_ASSERT(enumScope);
                if (enumScope->asSymbol().kind == SymbolKind::ClassType) {
                    auto containingClass = getContainingClass(scope).first;
                    if (containingClass &&
                        containingClass->isDerivedFrom(enumScope->asSymbol().as<ClassType>())) {
                        skipLocationCheck = true;
                    }
                }

                if (auto sm = scope.getCompilation().getSourceManager(); sm && !skipLocationCheck) {
                    auto loc = originalSyntax->getFirstToken().location();
                    locationGood =
                        sm->isBeforeInCompilationUnit(wrapped.location, loc).value_or(true);
                }
            }
        }

        if (locationGood || flags.has(LookupFlags::AllowDeclaredAfter)) {
            // Unwrap the symbol if it's hidden behind an import or hoisted enum member.
            if (symbol->kind == SymbolKind::TransparentMember) {
                do {
                    symbol = &symbol->as<TransparentMemberSymbol>().wrapped;
                } while (symbol->kind == SymbolKind::TransparentMember);

                // Special case check for a lookup finding hoisted members of an anonymous
                // program. For these we need to verify that the original lookup location is
                // also in a program.
                if (symbol->getParentScope()->asSymbol().kind == SymbolKind::AnonymousProgram &&
                    !isInProgram(originalScope.asSymbol()) && sourceRange) {
                    auto& diag = result.addDiag(scope, diag::IllegalReferenceToProgramItem,
                                                *sourceRange);
                    diag.addNote(diag::NoteDeclarationHere, symbol->location);
                }
            }

            switch (symbol->kind) {
                case SymbolKind::ExplicitImport:
                    result.found = symbol->as<ExplicitImportSymbol>().importedSymbol();
                    result.flags |= LookupResultFlags::WasImported;
                    scope.getCompilation().noteReference(*symbol);
                    break;
                case SymbolKind::ForwardingTypedef:
                    // If we find a forwarding typedef, the actual typedef was never defined.
                    // Just ignore it, we'll issue a better error later.
                    break;
                case SymbolKind::MethodPrototype:
                    // Looking up a prototype should always forward on to the actual method.
                    result.found = symbol->as<MethodPrototypeSymbol>().getSubroutine();
                    break;
                case SymbolKind::ModportClocking:
                    result.found = symbol->as<ModportClockingSymbol>().target;
                    break;
                default:
                    result.found = symbol;
                    break;
            }

            // We have a fully resolved and valid symbol. Before we return back to the caller,
            // make sure that the symbol we're returning isn't in the process of having its type
            // evaluated. This can only happen with a mutually recursive definition of something
            // like a parameter and a function, so detect and report the error here to avoid a
            // stack overflow.
            bool done = true;
            if (result.found) {
                auto declaredType = result.found->getDeclaredType();
                if (declaredType && declaredType->isEvaluating()) {
                    if (locationGood) {
                        reportRecursiveError(*result.found);
                    }
                    else {
                        // We overrode the location checking via a flag and
                        // it's probably biting us now by causing us to find
                        // our own symbol when we otherwise shouldn't.
                        // Work around this by just pretending we didn't find anything.
                        done = false;
                        result.clear();
                    }
                }
            }

            if (done)
                return;
        }
    }

    // Look through any wildcard imports prior to the lookup point and see if their packages
    // contain the name we're looking for.
    if (auto wildcardImportData = scope.getWildcardImportData()) {
        if (flags.has(LookupFlags::DisallowWildcardImport)) {
            // We're in a context that disallows new imports via wildcard imports,
            // but we can still reference any symbols that were previously imported
            // that way from some other lookup. In order to be sure we've seen all of
            // those lookups we need to force elaborate the scope first.
            if (!wildcardImportData->hasForceElaborated) {
                wildcardImportData->hasForceElaborated = true;
                scope.getCompilation().forceElaborate(scope.asSymbol());
            }

            if (auto it = wildcardImportData->importedSymbols.find(name);
                it != wildcardImportData->importedSymbols.end()) {
                result.flags |= LookupResultFlags::WasImported;
                result.found = it->second;
                return;
            }
        }
        else {
            struct Import {
                const Symbol* imported;
                const WildcardImportSymbol* import;
            };
            SmallVector<Import, 4> imports;
            SmallSet<const Symbol*, 2> importDedup;

            for (auto import : wildcardImportData->wildcardImports) {
                if (location < LookupLocation::after(*import))
                    break;

                auto package = import->getPackage();
                if (!package) {
                    result.flags |= LookupResultFlags::SuppressUndeclared;
                    continue;
                }

                const Symbol* imported = package->findForImport(name);
                if (imported && importDedup.emplace(imported).second)
                    imports.emplace_back(Import{imported, import});
            }

            if (!imports.empty()) {
                if (imports.size() > 1) {
                    if (sourceRange) {
                        auto& diag = result.addDiag(scope, diag::AmbiguousWildcardImport,
                                                    *sourceRange);
                        diag << name;
                        for (const auto& pair : imports) {
                            diag.addNote(diag::NoteImportedFrom, pair.import->location);
                            diag.addNote(diag::NoteDeclarationHere, pair.imported->location);
                        }
                    }
                    return;
                }

                if (symbol && sourceRange) {
                    // The existing symbol might be an import for the thing we just imported
                    // via wildcard, which is fine so don't error for that case.
                    if (symbol->kind != SymbolKind::ExplicitImport ||
                        symbol->as<ExplicitImportSymbol>().importedSymbol() !=
                            imports[0].imported) {

                        auto& diag = result.addDiag(scope, diag::ImportNameCollision, *sourceRange);
                        diag << name;
                        diag.addNote(diag::NoteDeclarationHere, symbol->location);
                        diag.addNote(diag::NoteImportedFrom, imports[0].import->location);
                        diag.addNote(diag::NoteDeclarationHere, imports[0].imported->location);
                    }
                }

                result.flags |= LookupResultFlags::WasImported;
                result.found = imports[0].imported;
                scope.getCompilation().noteReference(*imports[0].import);

                wildcardImportData->importedSymbols.try_emplace(result.found->name, result.found);
                return;
            }
        }
    }

    // Continue up the scope chain via our parent.
    location = LookupLocation::after(scope.asSymbol());
    if (!location.getScope())
        return;

    // If this scope was an out-of-block subroutine, tell the next recursive call about it.
    // Otherwise, if our previous call was for such a situation and we didn't find the symbol
    // in this class scope, we need to use the subroutine's out-of-block lookup location
    // instead in order to properly handle cases like:
    //   class C;
    //     extern function int foo;
    //   endclass
    //   localparam int k = ...;
    //   function int C::foo;
    //     return k;
    //   endfunction
    auto& sym = scope.asSymbol();
    if (sym.kind == SymbolKind::Subroutine) {
        outOfBlockIndex = sym.as<SubroutineSymbol>().outOfBlockIndex;
    }
    else if (sym.kind == SymbolKind::ConstraintBlock) {
        outOfBlockIndex = sym.as<ConstraintBlockSymbol>().getOutOfBlockIndex();
    }
    else if (uint32_t(outOfBlockIndex) != 0) {
        location = LookupLocation(location.getScope(), uint32_t(outOfBlockIndex));
        outOfBlockIndex = SymbolIndex(0);
    }

    if (sym.kind == SymbolKind::ClassType) {
        // Suppress errors when we fail to find a symbol inside a class that
        // had a problem resolving its base class, since the symbol may be
        // expected to be defined in the base.
        auto baseClass = sym.as<ClassType>().getBaseClass();
        if (baseClass && baseClass->isError())
            result.flags |= LookupResultFlags::SuppressUndeclared;
    }

    if (flags.has(LookupFlags::DisallowUnitReferences) &&
        location.getScope()->asSymbol().kind == SymbolKind::CompilationUnit) {
        return;
    }

    return unqualifiedImpl(*location.getScope(), name, location, sourceRange, flags,
                           outOfBlockIndex, result, originalScope, originalSyntax);
}